

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<std::unordered_set<duckdb::QualifiedColumnName,duckdb::QualifiedColumnHashFunction,duckdb::QualifiedColumnEquality,std::allocator<duckdb::QualifiedColumnName>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  __hashtable *__h;
  long lVar2;
  QualifiedColumnName val;
  type *local_b8;
  QualifiedColumnName local_b0;
  
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      QualifiedColumnName::Deserialize(&local_b0,this);
      (*this->_vptr_Deserializer[7])(this);
      local_b8 = __return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::QualifiedColumnName,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::QualifiedColumnName,true>>>>
                ((_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,&local_b0,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.column._M_dataplus._M_p != &local_b0.column.field_2) {
        operator_delete(local_b0.column._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.table._M_dataplus._M_p != &local_b0.table.field_2) {
        operator_delete(local_b0.table._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.schema._M_dataplus._M_p != &local_b0.schema.field_2) {
        operator_delete(local_b0.schema._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.catalog._M_dataplus._M_p != &local_b0.catalog.field_2) {
        operator_delete(local_b0.catalog._M_dataplus._M_p);
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_unordered_set<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_unordered_set<T>::ELEMENT_TYPE;
		auto size = OnListBegin();
		T set;
		for (idx_t i = 0; i < size; i++) {
			set.insert(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return set;
	}